

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feat.c
# Opt level: O2

int32 ** parse_subvecs(char *str)

{
  uint uVar1;
  char cVar2;
  int iVar3;
  glist_t pgVar4;
  int32 **ppiVar5;
  ulong uVar6;
  int32 *piVar7;
  gnode_s *pgVar8;
  long ln;
  char *pcVar9;
  long lVar10;
  glist_t g;
  gnode_s *pgVar11;
  uint local_50;
  uint local_4c;
  char *local_48;
  int32 l;
  glist_t local_38;
  
  local_38 = (glist_t)0x0;
  local_48 = str;
  while( true ) {
    pgVar4 = (glist_t)0x0;
    while( true ) {
      iVar3 = __isoc99_sscanf(str,"%d%n",&local_50,&l);
      if (iVar3 != 1) {
        lVar10 = (long)str - (long)local_48;
        pcVar9 = "\'%s\': Couldn\'t read int32 @pos %d\n";
        ln = 0xbb;
        goto LAB_0011d4df;
      }
      pcVar9 = str + l;
      if (str[l] == '-') {
        pcVar9 = pcVar9 + 1;
        iVar3 = __isoc99_sscanf(pcVar9,"%d%n",&local_4c,&l);
        if (iVar3 != 1) {
          lVar10 = (long)pcVar9 - (long)local_48;
          pcVar9 = "\'%s\': Couldn\'t read int32 @pos %d\n";
          ln = 0xc3;
          goto LAB_0011d4df;
        }
        pcVar9 = pcVar9 + l;
      }
      else {
        local_4c = local_50;
      }
      if (((int)local_50 < 0) || ((int)local_4c < (int)local_50)) {
        lVar10 = (long)pcVar9 - (long)local_48;
        pcVar9 = "\'%s\': Bad subrange spec ending @pos %d\n";
        ln = 0xcb;
        goto LAB_0011d4df;
      }
      for (; (int)local_50 <= (int)local_4c; local_50 = local_50 + 1) {
        for (pgVar8 = pgVar4; pgVar8 != (glist_t)0x0; pgVar8 = pgVar8->next) {
          if ((pgVar8->data).ptr == (void *)(long)(int)local_50) {
            lVar10 = (long)pcVar9 - (long)local_48;
            pcVar9 = "\'%s\': Duplicate dimension ending @pos %d\n";
            ln = 0xd4;
            goto LAB_0011d4df;
          }
        }
        pgVar4 = glist_add_int32(pgVar4,local_50);
      }
      cVar2 = *pcVar9;
      if (cVar2 != ',') break;
      str = pcVar9 + 1;
    }
    if ((cVar2 != '\0') && (cVar2 != '/')) break;
    pgVar4 = glist_add_ptr(local_38,pgVar4);
    local_38 = pgVar4;
    if (*pcVar9 != '/') {
      if (*pcVar9 != '\0') {
        __assert_fail("*strp == \'/\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                      ,0xe7,"int32 **parse_subvecs(const char *)");
      }
      local_50 = glist_count(pgVar4);
      ppiVar5 = (int32 **)
                __ckd_calloc__((long)(int)(local_50 + 1),8,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                               ,0xed);
      uVar6 = (ulong)(int)local_50;
      ppiVar5[uVar6] = (int32 *)0x0;
      pgVar8 = pgVar4;
      while( true ) {
        iVar3 = (int)uVar6;
        local_50 = iVar3 - 1;
        if ((iVar3 < 1) || (pgVar8 == (glist_t)0x0)) {
          if ((iVar3 < 1) && (pgVar11 = pgVar4, pgVar8 == (glist_t)0x0)) {
            for (; pgVar11 != (glist_t)0x0; pgVar11 = pgVar11->next) {
              glist_free((glist_t)(pgVar11->data).ptr);
            }
            glist_free(pgVar4);
            return ppiVar5;
          }
          __assert_fail("(n < 0) && (!gn)",
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                        ,0xfe,"int32 **parse_subvecs(const char *)");
        }
        g = (glist_t)(pgVar8->data).ptr;
        local_4c = glist_count(g);
        if ((int)local_4c < 1) break;
        piVar7 = (int32 *)__ckd_calloc__((ulong)(local_4c + 1),4,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                                         ,0xf7);
        ppiVar5[(int)local_50] = piVar7;
        piVar7[(int)local_4c] = -1;
        for (; (uVar1 = local_4c - 1, 0 < (int)local_4c && (g != (glist_t)0x0)); g = g->next) {
          ppiVar5[(int)local_50][uVar1] = *(int32 *)&g->data;
          local_4c = uVar1;
        }
        if ((0 < (int)local_4c) || (g != (glist_t)0x0)) {
          local_4c = uVar1;
          __assert_fail("(n2 < 0) && (!gn2)",
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                        ,0xfc,"int32 **parse_subvecs(const char *)");
        }
        pgVar8 = pgVar8->next;
        uVar6 = (ulong)local_50;
        local_4c = uVar1;
      }
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
              ,0xf5,"\'%s\': 0-length subvector\n",local_48);
LAB_0011d4e6:
      exit(1);
    }
    str = pcVar9 + 1;
  }
  lVar10 = (long)pcVar9 - (long)local_48;
  pcVar9 = "\'%s\': Bad delimiter @pos %d\n";
  ln = 0xdd;
LAB_0011d4df:
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
          ,ln,pcVar9,local_48,lVar10);
  goto LAB_0011d4e6;
}

Assistant:

int32 **
parse_subvecs(char const *str)
{
    char const *strp;
    int32 n, n2, l;
    glist_t dimlist;            /* List of dimensions in one subvector */
    glist_t veclist;            /* List of dimlists (subvectors) */
    int32 **subvec;
    gnode_t *gn, *gn2;

    veclist = NULL;

    strp = str;
    for (;;) {
        dimlist = NULL;

        for (;;) {
            if (sscanf(strp, "%d%n", &n, &l) != 1)
                E_FATAL("'%s': Couldn't read int32 @pos %d\n", str,
                        strp - str);
            strp += l;

            if (*strp == '-') {
                strp++;

                if (sscanf(strp, "%d%n", &n2, &l) != 1)
                    E_FATAL("'%s': Couldn't read int32 @pos %d\n", str,
                            strp - str);
                strp += l;
            }
            else
                n2 = n;

            if ((n < 0) || (n > n2))
                E_FATAL("'%s': Bad subrange spec ending @pos %d\n", str,
                        strp - str);

            for (; n <= n2; n++) {
		gnode_t *gn;
		for (gn = dimlist; gn; gn = gnode_next(gn))
		    if (gnode_int32(gn) == n)
			break;
		if (gn != NULL)
                    E_FATAL("'%s': Duplicate dimension ending @pos %d\n",
                            str, strp - str);

                dimlist = glist_add_int32(dimlist, n);
            }

            if ((*strp == '\0') || (*strp == '/'))
                break;

            if (*strp != ',')
                E_FATAL("'%s': Bad delimiter @pos %d\n", str, strp - str);

            strp++;
        }

        veclist = glist_add_ptr(veclist, (void *) dimlist);

        if (*strp == '\0')
            break;

        assert(*strp == '/');
        strp++;
    }

    /* Convert the glists to arrays; remember the glists are in reverse order of the input! */
    n = glist_count(veclist);   /* #Subvectors */
    subvec = (int32 **) ckd_calloc(n + 1, sizeof(int32 *));     /* +1 for sentinel */
    subvec[n] = NULL;           /* sentinel */

    for (--n, gn = veclist; (n >= 0) && gn; gn = gnode_next(gn), --n) {
        gn2 = (glist_t) gnode_ptr(gn);

        n2 = glist_count(gn2);  /* Length of this subvector */
        if (n2 <= 0)
            E_FATAL("'%s': 0-length subvector\n", str);

        subvec[n] = (int32 *) ckd_calloc(n2 + 1, sizeof(int32));        /* +1 for sentinel */
        subvec[n][n2] = -1;     /* sentinel */

        for (--n2; (n2 >= 0) && gn2; gn2 = gnode_next(gn2), --n2)
            subvec[n][n2] = gnode_int32(gn2);
        assert((n2 < 0) && (!gn2));
    }
    assert((n < 0) && (!gn));

    /* Free the glists */
    for (gn = veclist; gn; gn = gnode_next(gn)) {
        gn2 = (glist_t) gnode_ptr(gn);
        glist_free(gn2);
    }
    glist_free(veclist);

    return subvec;
}